

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StandardLibrary.h
# Opt level: O2

CodeLocation soul::getSystemModule(string_view moduleName)

{
  char *__s;
  char *in_RDX;
  char *extraout_RDX;
  char *extraout_RDX_00;
  UTF8Reader UVar1;
  soul *in_RSI;
  Ptr in_RDI;
  string_view moduleName_00;
  CodeLocation CVar2;
  allocator<char> local_6a;
  allocator<char> local_69;
  undefined1 local_68 [24];
  string local_50;
  string local_30;
  
  moduleName_00._M_str = in_RDX;
  moduleName_00._M_len = (size_t)in_RDX;
  __s = getSystemModuleCode(in_RSI,moduleName_00);
  if (__s == (char *)0x0) {
    *(undefined8 *)in_RDI.object = 0;
    ((in_RDI.object)->filename)._M_dataplus._M_p = (char *)0x0;
    UVar1.data = extraout_RDX;
  }
  else {
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_30,
               (basic_string_view<char,_std::char_traits<char>_> *)(local_68 + 8),&local_69);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_6a);
    SourceCodeText::createInternal((SourceCodeText *)local_68,&local_30,&local_50);
    CodeLocation::CodeLocation((CodeLocation *)in_RDI.object,(Ptr *)local_68);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
              ((RefCountedPtr<soul::SourceCodeText> *)local_68);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
    UVar1.data = extraout_RDX_00;
  }
  CVar2.location.data = UVar1.data;
  CVar2.sourceCode.object = in_RDI.object;
  return CVar2;
}

Assistant:

inline CodeLocation getSystemModule (std::string_view moduleName)
{
    if (auto code = getSystemModuleCode (moduleName))
        return SourceCodeText::createInternal (std::string (moduleName), code);

    return {};
}